

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbordiagnostic.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_8921a0::DiagnosticNotation::~DiagnosticNotation(DiagnosticNotation *this)

{
  QString::~QString((QString *)0x467bec);
  QString::~QString((QString *)0x467bfa);
  QStack<int>::~QStack((QStack<int> *)0x467c04);
  return;
}

Assistant:

static QString create(const QCborValue &v, QCborValue::DiagnosticNotationOptions opts)
    {
        DiagnosticNotation dn(opts);
        dn.appendValue(v);
        return dn.result;
    }